

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-path.c
# Opt level: O2

wchar_t find_path(player *p,loc start,loc dest,int16_t **step_dirs)

{
  chunk_conflict2 *pcVar1;
  loc grid;
  _Bool _Var2;
  _Bool _Var3;
  _Bool _Var4;
  int iVar5;
  uint uVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  int iVar9;
  int iVar10;
  undefined7 extraout_var;
  ulong uVar11;
  int ***pppiVar12;
  int **ppiVar13;
  priority_queue *qp;
  loc lVar14;
  size_t sVar15;
  loc_conflict lVar16;
  undefined4 uVar17;
  ulong uVar18;
  wchar_t wVar19;
  uint uVar20;
  wchar_t wVar21;
  long lVar22;
  undefined1 auVar23 [16];
  uint uVar24;
  int16_t *local_d8;
  ulong local_c8;
  loc_conflict local_c0;
  wchar_t local_b8;
  undefined4 local_b4;
  size_t local_b0;
  undefined1 local_a8 [16];
  int16_t **local_98;
  loc local_90;
  ulong local_88;
  wchar_t local_7c;
  loc local_78;
  ulong local_70;
  wchar_t local_68;
  wchar_t local_64;
  wchar_t local_60;
  wchar_t local_5c;
  pfdistances_patched local_58;
  
  wVar21 = L'\xffffffff';
  if (((p->cave != (chunk_conflict2 *)0x0) &&
      (_Var2 = square_in_bounds((chunk_conflict *)p->cave,start), _Var2)) &&
     (_Var2 = square_in_bounds((chunk_conflict *)p->cave,dest), _Var2)) {
    _Var2 = loc_eq((loc_conflict)start,(loc_conflict)dest);
    if (!_Var2) {
      _Var2 = square_isknown((chunk_conflict *)p->cave,start);
      if (_Var2) {
        _Var2 = square_isknown((chunk_conflict *)p->cave,dest);
        uVar17 = (undefined4)CONCAT71(extraout_var,_Var2);
      }
      else {
        uVar17 = 0;
      }
      _Var4 = SUB41(uVar17,0);
      _Var2 = is_valid_pf(p,dest,_Var4,true);
      if ((!_Var2) && (_Var3 = is_valid_pf(p,dest,_Var4,false), !_Var3)) {
        if (step_dirs != (int16_t **)0x0) {
          *step_dirs = (int16_t *)0x0;
        }
        return L'\xffffffff';
      }
      local_88 = CONCAT44(local_88._4_4_,uVar17);
      local_98 = step_dirs;
      local_60 = compute_unlocked_penalty(p);
      local_64 = compute_locked_penalty(p);
      local_68 = compute_rubble_penalty(p);
      pcVar1 = p->cave;
      local_58.height = pcVar1->height;
      local_58.width = pcVar1->width;
      auVar23._0_4_ = -(uint)(L'\0' < local_58.height);
      auVar23._4_4_ = -(uint)(L'\0' < local_58.height);
      auVar23._8_4_ = -(uint)(L'\0' < local_58.width);
      auVar23._12_4_ = -(uint)(L'\0' < local_58.width);
      iVar5 = movmskpd((int)pcVar1,auVar23);
      if (iVar5 != 3) {
        __assert_fail("height > 0 && width > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-path.c"
                      ,0x25c,
                      "void initialize_patched_distances(struct pfdistances_patched *, int, int)");
      }
      local_70 = (ulong)start >> 0x20;
      uVar11 = (ulong)dest >> 0x20;
      local_58.patch_size = L'\x10';
      local_58.patch_shift = L'\x04';
      local_58.patch_mask = L'\x0f';
      uVar24 = (((uint)local_58.height >> 4) - (uint)((local_58.height & 0xfU) == 0)) + 1;
      local_a8._0_8_ =
           CONCAT44((((uint)local_58.width >> 4) - (uint)((local_58.width & 0xfU) == 0)) + 1,uVar24)
      ;
      local_a8._8_8_ = 0;
      local_90 = start;
      local_58._20_8_ = local_a8._0_8_;
      pppiVar12 = (int ***)mem_alloc((ulong)(uVar24 * 8));
      uVar20 = local_a8._4_4_ << 3;
      local_58.patches = pppiVar12;
      for (uVar18 = 0; lVar14 = local_90, uVar24 != uVar18; uVar18 = uVar18 + 1) {
        ppiVar13 = (int **)mem_zalloc((ulong)uVar20);
        pppiVar12[uVar18] = ppiVar13;
      }
      local_c8._0_4_ = dest.y;
      uVar24 = (int)local_70 - (wchar_t)local_c8;
      uVar20 = -uVar24;
      if (0 < (int)uVar24) {
        uVar20 = uVar24;
      }
      wVar21 = local_90.x;
      uVar6 = wVar21 - dest.x;
      uVar24 = -uVar6;
      if (0 < (int)uVar6) {
        uVar24 = uVar6;
      }
      if (uVar24 < uVar20) {
        uVar24 = uVar20;
      }
      qp = qp_new((ulong)(uVar24 * 4 + 8));
      initialize_patch(&local_58,lVar14,p,_Var4,_Var2);
      set_patched_distance(&local_58,lVar14,L'\0');
      local_c0.x = wVar21;
      local_78 = dest;
LAB_0019c3d9:
      local_b4 = 0;
      uVar20 = (uint)local_88;
LAB_0019c3eb:
      local_c0.y = (int)local_70;
      wVar21 = L'\0';
      do {
        local_b8 = L'\xffffffff';
        wVar21 = wVar21 + L'\x10';
        local_b0 = CONCAT44(local_b0._4_4_,0xffffffff);
        for (lVar22 = 0; lVar22 != 8; lVar22 = lVar22 + 1) {
          lVar16.y = local_c0.y;
          lVar16.x = local_c0.x;
          lVar14 = (loc)loc_sum(lVar16,(loc_conflict)ddgrid_ddd[lVar22]);
          _Var4 = loc_eq((loc_conflict)lVar14,(loc_conflict)dest);
          if (_Var4) {
            iVar9 = (wchar_t)local_c8 - (int)local_70;
            iVar5 = -iVar9;
            if (0 < iVar9) {
              iVar5 = iVar9;
            }
            iVar10 = dest.x - local_90.x;
            iVar9 = -iVar10;
            if (0 < iVar10) {
              iVar9 = iVar10;
            }
            uVar20 = iVar5 + iVar9 + 2;
            local_d8 = (int16_t *)mem_alloc((ulong)((iVar9 + iVar5) * 2 + 4));
            wVar21 = L'\x7fffffff';
            uVar18 = 0;
            local_c8 = uVar11;
            goto LAB_0019c871;
          }
          local_a8._0_8_ = lVar22;
          _Var4 = has_patched_distance(&local_58,lVar14);
          if (!_Var4) {
            initialize_patch(&local_58,lVar14,p,(_Bool)((byte)uVar20 & 1),_Var2);
          }
          wVar7 = get_patched_distance(&local_58,lVar14);
          if (wVar21 < wVar7) {
            uVar24 = dest.x - lVar14.x;
            uVar20 = -uVar24;
            if (0 < (int)uVar24) {
              uVar20 = uVar24;
            }
            uVar6 = (wchar_t)local_c8 - lVar14.y;
            uVar24 = -uVar6;
            if (0 < (int)uVar6) {
              uVar24 = uVar6;
            }
            if (uVar24 < uVar20) {
              uVar24 = uVar20;
            }
            if (uVar24 < 0x8000000) {
              wVar19 = uVar24 * 0x10 ^ 0x7fffffff;
              dest = local_78;
              if (wVar21 < wVar19) {
                _Var4 = square_isknown((chunk_conflict *)p->cave,lVar14);
                local_7c = L'\0';
                if (_Var4) {
                  local_5c = wVar19;
                  _Var4 = square_ispassable((chunk_conflict *)p->cave,lVar14);
                  wVar19 = (wchar_t)local_b0;
                  if (!_Var4) {
                    _Var4 = square_iscloseddoor((chunk_conflict *)p->cave,lVar14);
                    if (_Var4) {
                      _Var4 = square_islockeddoor((chunk_conflict *)p->cave,lVar14);
                      wVar8 = local_60;
                      if (_Var4) {
                        wVar8 = local_64;
                      }
                    }
                    else {
                      _Var4 = square_isrubble((chunk_conflict *)p->cave,lVar14);
                      wVar8 = L'\x7fffffff';
                      if (_Var4) {
                        wVar8 = local_68;
                      }
                    }
                    dest = local_78;
                    if ((wVar7 - wVar8 <= wVar21) || (local_7c = wVar8, local_5c - wVar8 <= wVar21))
                    goto LAB_0019c6bc;
                  }
                }
                else {
                  wVar19 = (wchar_t)local_b0;
                }
                lVar22 = local_a8._0_8_;
                if (L'\0' < wVar19) {
                  local_b0 = qp_len(qp);
                  sVar15 = qp_size(qp);
                  if (local_b0 == sVar15) {
                    sVar15 = qp_size(qp);
                    if (sVar15 == 0) {
                      __assert_fail("qp_size(pending) > 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-path.c"
                                    ,0x4e1,
                                    "int find_path(struct player *, struct loc, struct loc, int16_t **)"
                                   );
                    }
                    sVar15 = qp_size(qp);
                    if (-1 < (long)sVar15) {
                      sVar15 = qp_size(qp);
                      _Var4 = qp_resize(qp,sVar15 * 2,(_func_void_void_ptr *)0x0);
                      if (!_Var4) goto LAB_0019c61e;
                    }
                    release_patched_distances(&local_58);
                    qp_free(qp,(_func_void_void_ptr *)0x0);
                    if (local_98 == (int16_t **)0x0) {
                      return L'\xffffffff';
                    }
                    goto LAB_0019ca5b;
                  }
LAB_0019c61e:
                  qp_push_int(qp,local_b8,wVar19);
                }
                wVar7 = grid_to_i((loc_conflict)lVar14,p->cave->width);
                local_b0 = CONCAT44(local_b0._4_4_,wVar7);
                wVar7 = local_7c + wVar21;
                set_patched_distance(&local_58,lVar14,wVar7);
                dest = local_78;
                local_b8 = uVar24 * 0x10 + wVar7;
                goto LAB_0019c6c1;
              }
            }
LAB_0019c6bc:
            lVar22 = local_a8._0_8_;
          }
          else {
            lVar22 = local_a8._0_8_;
            if ((_Var2 != false) &&
               (_Var4 = square_isknown((chunk_conflict *)p->cave,lVar14), _Var4)) {
              _Var4 = square_isvisibletrap((chunk_conflict *)p->cave,lVar14);
              local_b4 = CONCAT31((int3)((uint)local_b4 >> 8),(byte)local_b4 | _Var4);
            }
          }
LAB_0019c6c1:
          uVar20 = (uint)local_88;
        }
        if ((wchar_t)local_b0 < L'\0') {
          sVar15 = qp_len(qp);
          if (sVar15 == 0) goto LAB_0019c74b;
          wVar21 = qp_pop_int(qp);
        }
        else {
          wVar21 = qp_pushpop_int(qp,local_b8,(wchar_t)local_b0);
        }
        i_to_grid(wVar21,p->cave->width,&local_c0);
        lVar14.y = local_c0.y;
        lVar14.x = local_c0.x;
        _Var4 = has_patched_distance(&local_58,lVar14);
        if (!_Var4) {
          __assert_fail("has_patched_distance(&distances, next)",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-path.c"
                        ,0x534,"int find_path(struct player *, struct loc, struct loc, int16_t **)")
          ;
        }
        grid.y = local_c0.y;
        grid.x = local_c0.x;
        wVar21 = get_patched_distance(&local_58,grid);
      } while( true );
    }
    wVar21 = L'\0';
  }
  if (step_dirs == (int16_t **)0x0) {
    return wVar21;
  }
  *step_dirs = (int16_t *)0x0;
  return wVar21;
LAB_0019c871:
  lVar16 = (loc_conflict)((ulong)dest & 0xffffffff | local_c8 << 0x20);
  _Var2 = loc_eq(lVar16,(loc_conflict)local_90);
  if (_Var2) {
    if (local_98 == (int16_t **)0x0) {
      mem_free(local_d8);
    }
    else {
      *local_98 = local_d8;
    }
LAB_0019ca11:
    release_patched_distances(&local_58);
    qp_free(qp,(_func_void_void_ptr *)0x0);
    return (wchar_t)uVar18;
  }
  local_88 = uVar18;
  dest = (loc)loc(-1,-1);
  local_c8 = (ulong)dest >> 0x20;
  local_a8._0_4_ = 0xffffffff;
  for (lVar22 = 0; uVar18 = local_88, lVar22 != 8; lVar22 = lVar22 + 1) {
    lVar14 = (loc)loc_sum(lVar16,(loc_conflict)ddgrid_ddd[lVar22]);
    _Var2 = has_patched_distance(&local_58,lVar14);
    if ((_Var2) &&
       (wVar7 = get_patched_distance(&local_58,lVar14), wVar7 < wVar21 && L'\xffffffff' < wVar7)) {
      local_c8 = (ulong)lVar14 >> 0x20;
      dest = (loc)((ulong)lVar14 & 0xffffffff);
      local_a8._0_4_ = (int)lVar22;
      wVar21 = wVar7;
    }
  }
  if ((int)local_a8._0_4_ < 0) {
    __assert_fail("best_k >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-path.c"
                  ,0x309,
                  "int patched_distances_to_path(const struct pfdistances_patched *, struct loc, struct loc, int16_t **)"
                 );
  }
  if (((((wchar_t)local_c8 < L'\0') || (local_58.height <= (wchar_t)local_c8)) || (dest.x < L'\0'))
     || (local_58.width <= dest.x)) {
    __assert_fail("best_grid.y >= 0 && best_grid.y < distances->height && best_grid.x >= 0 && best_grid.x < distances->width"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-path.c"
                  ,0x30b,
                  "int patched_distances_to_path(const struct pfdistances_patched *, struct loc, struct loc, int16_t **)"
                 );
  }
  if ((long)(int)uVar20 < (long)local_88) {
    __assert_fail("length <= allocated && allocated > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-path.c"
                  ,0x30d,
                  "int patched_distances_to_path(const struct pfdistances_patched *, struct loc, struct loc, int16_t **)"
                 );
  }
  if (local_88 == uVar20) {
    if (0x3fffffff < (int)uVar20) {
      mem_free(local_d8);
      uVar18 = 0xffffffffffffffff;
      if (local_98 != (int16_t **)0x0) {
        *local_98 = (int16_t *)0x0;
      }
      goto LAB_0019ca11;
    }
    local_d8 = (int16_t *)mem_realloc(local_d8,(ulong)(uVar20 << 2));
    uVar20 = uVar20 * 2;
  }
  local_d8[uVar18] = 10 - ddd[(uint)local_a8._0_4_];
  uVar18 = uVar18 + 1;
  goto LAB_0019c871;
LAB_0019c74b:
  if (((_Var2 == false) || (_Var2 = player_is_trapsafe(p), _Var2)) ||
     ((((byte)local_b4 ^ 1) & 1) != 0)) goto LAB_0019c7b5;
  clear_patched_distances(&local_58);
  lVar14 = local_90;
  _Var2 = false;
  initialize_patch(&local_58,local_90,p,(_Bool)((byte)uVar20 & 1),false);
  set_patched_distance(&local_58,lVar14,L'\0');
  local_c0.x = lVar14.x;
  goto LAB_0019c3eb;
LAB_0019c7b5:
  if ((uVar20 & 1) == 0) {
    release_patched_distances(&local_58);
    qp_free(qp,(_func_void_void_ptr *)0x0);
    if (local_98 == (int16_t **)0x0) {
      return L'\xffffffff';
    }
LAB_0019ca5b:
    *local_98 = (int16_t *)0x0;
    return L'\xffffffff';
  }
  local_88 = local_88 & 0xffffffff00000000;
  _Var2 = is_valid_pf(p,dest,false,true);
  clear_patched_distances(&local_58);
  lVar14 = local_90;
  initialize_patch(&local_58,local_90,p,false,_Var2);
  set_patched_distance(&local_58,lVar14,L'\0');
  local_c0.x = lVar14.x;
  goto LAB_0019c3d9;
}

Assistant:

int find_path(struct player *p, struct loc start, struct loc dest,
		int16_t **step_dirs)
{
	/*
	 * Store the grid at the head of the path in the queue and have
	 * separate storage for a distance array.  Initialize that distance
	 * array in patches of patch_size by patch_size to limit overhead from
	 * parts of the cave that are not traversed when moving to the
	 * destination.
	 */
	struct pfdistances_patched distances;
	struct priority_queue *pending;
	struct loc next;
	int dist_next;
	int unlocked_penalty, locked_penalty, rubble_penalty;
	bool only_known, forbid_traps, hit_trap;

	if (!p->cave || !square_in_bounds(p->cave, start)
			|| !square_in_bounds(p->cave, dest)) {
		if (step_dirs) {
			*step_dirs = NULL;
		}
		return -1;
	}

	if (loc_eq(start, dest)) {
		if (step_dirs) {
			*step_dirs = NULL;
		}
		return 0;
	}

	/*
	 * If both the starting point and destination are remembered grids,
	 * first try paths that only traverse remembered grids.  If there are
	 * no such paths, then try ones that can include grids that are not
	 * remembered.
	 */
	only_known = square_isknown(p->cave, start)
		&& square_isknown(p->cave, dest);
	/*
	 * First try paths that do not go through grids with known visible
	 * traps.  If there are no such paths, then try paths that include
	 * known visible traps.
	 */
	if (is_valid_pf(p, dest, only_known, true)) {
		forbid_traps = true;
	} else if (is_valid_pf(p, dest, only_known, false)) {
		forbid_traps = false;
	} else {
		/*
		 * The destination is not reachable because it contains
		 * known terrain that pathfinding can not traverse.
		 */
		if (step_dirs) {
			*step_dirs = NULL;
		}
		return -1;
	}
	/*
	 * Remember if the pathfinding would change because of a known visible
	 * trap.
	 */
	hit_trap = false;

	/* Precompute quantities to penalize traversing some terrain. */
	unlocked_penalty = compute_unlocked_penalty(p);
	locked_penalty = compute_locked_penalty(p);
	rubble_penalty = compute_rubble_penalty(p);

	initialize_patched_distances(&distances, p->cave->height,
		p->cave->width);

	/* Set up the priority queue of feasible paths to consider. */
	pending = qp_new(4 * (2 + MAX(ABS(start.y - dest.y),
		ABS(start.x - dest.x))));

	initialize_patch(&distances, start, p, only_known, forbid_traps);
	set_patched_distance(&distances, start, 0);
	next = start;
	dist_next = 0;
	while (1) {
		int add_grid = -1, add_priority = -1;
		/* This is the base distance to any neighbor. */
		int dist_this = dist_next + PF_SCL, i;

		/* Try the neighbors. */
		for (i = 0; i < 8; ++i) {
			struct loc this_grid = loc_sum(next, ddgrid_ddd[i]);
			int dist_stored, dist_remaining, penalty;

			if (loc_eq(this_grid, dest)) {
				/* Reached the destination. */
				int length = patched_distances_to_path(
					&distances, start, dest,
					step_dirs);

				release_patched_distances(&distances);
				qp_free(pending, NULL);
				return length;
			}

			if (!has_patched_distance(&distances, this_grid)) {
				initialize_patch(&distances, this_grid,
					p, only_known, forbid_traps);
			}
			dist_stored = get_patched_distance(&distances,
				this_grid);
			if (dist_stored <= dist_this) {
				/*
				 * Since it is unreachable or already has been
				 * visited by a path that is not longer than
				 * this one, do not need to consider it.  If
				 * not allowing traps and this grid is a known
				 * visible trap, remember that there is at
				 * least one trap that affects the pathfinding.
				 */
				if (forbid_traps && square_isknown(p->cave,
						this_grid)
						&& square_isvisibletrap(
						p->cave, this_grid)) {
					hit_trap = true;
				}
				continue;
			}

			/*
			 * Use A* pathfinding:  add an estimate (in this case
			 * the Chebyshev distance) to get from this_grid to
			 * the destination.
			 */
			dist_remaining = MAX(ABS(dest.x - this_grid.x),
				ABS(dest.y - this_grid.y));
			if (dist_remaining > INT_MAX / PF_SCL
					|| dist_this >= INT_MAX
					- PF_SCL * dist_remaining) {
				/*
				 * Can not reach the destination from this_grid
				 * in a reasonable number of turns, so skip
				 * it.
				 */
				continue;
			}
			dist_remaining *= PF_SCL;

			if (square_isknown(p->cave, this_grid)
					&& !square_ispassable(p->cave,
					this_grid)) {
				/*
				 * Penalize the distance for some known but
				 * impassable terrain.
				 */
				if (square_iscloseddoor(p->cave, this_grid)) {
					penalty = (square_islockeddoor(p->cave,
						this_grid)) ? locked_penalty :
						unlocked_penalty;
				} else if (square_isrubble(p->cave,
						this_grid)) {
					penalty = rubble_penalty;
				} else {
					/*
					 * Should not happen, treat it as
					 * completely impassable.
					 */
					penalty = INT_MAX;
				}

				if (dist_this >= dist_stored - penalty
						|| dist_this >= INT_MAX -
						penalty - dist_remaining) {
					/*
					 * The penalty makes this path
					 * no shorter than what has already
					 * reached this grid or puts the
					 * destination out of reach.  Skip it.
					 */
					continue;
				}
			} else {
				penalty = 0;
			}

			/* Push what is pending onto the queue. */
			if (add_grid > 0) {
				if (qp_len(pending) == qp_size(pending)) {
					assert(qp_size(pending) > 0);
					if (qp_size(pending) > SIZE_MAX / 2 ||
							qp_resize(pending, 2
							* qp_size(pending),
							NULL)) {
						/*
						 * Could not resize so give
						 * up.
						 */
						release_patched_distances(
							&distances);
						qp_free(pending, NULL);
						if (step_dirs) {
							*step_dirs = NULL;
						}
						return -1;
					}
				}
				qp_push_int(pending, add_priority, add_grid);
			}
			add_grid = grid_to_i(this_grid, p->cave->width);
			add_priority = dist_this + penalty + dist_remaining;
			set_patched_distance(&distances, this_grid,
				dist_this + penalty);
		}

		if (add_grid >= 0) {
			i_to_grid(qp_pushpop_int(pending, add_priority,
				add_grid), p->cave->width, &next);
		} else {
			if (qp_len(pending) == 0) {
				/*
				 * Exhausted possible paths without reaching
				 * the destination.
				 */
				if (forbid_traps && !player_is_trapsafe(p)
						&& hit_trap) {
					/*
					 * Retry but allow grids that contain
					 * known visible traps.
					 */
					forbid_traps = false;
					clear_patched_distances(&distances);
					initialize_patch(&distances, start,
						p, only_known, forbid_traps);
					set_patched_distance(&distances,
						start, 0);
					next = start;
					dist_next = 0;
					continue;
				}
				if (only_known) {
					/*
					 * Retry but allow grids that are not
					 * in the player's memory.
					 */
					only_known = false;
					if (is_valid_pf(p, dest, false, true)) {
						forbid_traps = true;
					} else {
						forbid_traps = false;
					}
					hit_trap = false;
					clear_patched_distances(&distances);
					initialize_patch(&distances, start,
						p, only_known, forbid_traps);
					set_patched_distance(&distances,
						start, 0);
					next = start;
					dist_next = 0;
					continue;
				}
				/* Nothing to retry so give up. */
				release_patched_distances(&distances);
				qp_free(pending, NULL);
				if (step_dirs) {
					*step_dirs = NULL;
				}
				return -1;
			}
			i_to_grid(qp_pop_int(pending), p->cave->width, &next);
		}
		/* The relevant patch should already have been initialized. */
		assert(has_patched_distance(&distances, next));
		dist_next = get_patched_distance(&distances, next);
	}
}